

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitemanimation.cpp
# Opt level: O3

qreal __thiscall QGraphicsItemAnimation::rotationAt(QGraphicsItemAnimation *this,qreal step)

{
  QGraphicsItemAnimationPrivate *this_00;
  long in_FS_OFFSET;
  qreal qVar1;
  undefined4 local_30;
  undefined8 local_2c;
  undefined8 uStack_24;
  undefined4 local_1c;
  char *local_18;
  qreal local_10;
  
  local_10 = *(qreal *)(in_FS_OFFSET + 0x28);
  if ((step < 0.0) || (this_00 = (QGraphicsItemAnimationPrivate *)this, 1.0 < step)) {
    this_00 = (QGraphicsItemAnimationPrivate *)&stack0xffffffffffffffd0;
    local_30 = 2;
    local_2c = 0;
    uStack_24 = 0;
    local_1c = 0;
    local_18 = "default";
    QMessageLogger::warning
              ((char *)this_00,"QGraphicsItemAnimation::%s: invalid step = %f","rotationAt");
  }
  qVar1 = QGraphicsItemAnimationPrivate::linearValueForStep
                    (this_00,step,
                     (QList<QGraphicsItemAnimationPrivate::Pair> *)(*(long *)(this + 0x10) + 0xb8),
                     0.0);
  if (*(qreal *)(in_FS_OFFSET + 0x28) == local_10) {
    return qVar1;
  }
  __stack_chk_fail();
}

Assistant:

qreal QGraphicsItemAnimation::rotationAt(qreal step) const
{
    check_step_valid(step, "rotationAt");
    return d->linearValueForStep(step, d->rotation);
}